

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

bool __thiscall cmCTestLaunch::CheckResults(cmCTestLaunch *this)

{
  bool bVar1;
  cmCTestLaunch *this_local;
  
  if ((this->Passthru & 1U) == 0) {
    bVar1 = IsError(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if ((((this->HaveErr & 1U) != 0) && (bVar1 = ScrapeLog(this,&this->LogErr), bVar1)) ||
            (((this->HaveOut & 1U) != 0 && (bVar1 = ScrapeLog(this,&this->LogOut), bVar1)))) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestLaunch::CheckResults()
{
  // Skip XML in passthru mode.
  if (this->Passthru) {
    return true;
  }

  // We always report failure for error conditions.
  if (this->IsError()) {
    return false;
  }

  // Scrape the output logs to look for warnings.
  if ((this->HaveErr && this->ScrapeLog(this->LogErr)) ||
      (this->HaveOut && this->ScrapeLog(this->LogOut))) {
    return false;
  }
  return true;
}